

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O2

void __thiscall pg::PTLSolver::solve(PTLSolver *this)

{
  bitset *this_00;
  bitset *Z;
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  bool local_5a;
  bool local_59;
  bitset CurG;
  
  bitset::bitset(&CurG,((this->super_Solver).game)->n_vertices);
  this->iterations = 0;
  this_00 = &this->G;
  Z = &this->S0;
  local_5a = true;
  local_59 = true;
  do {
    bVar5 = bitset::any(this_00);
    if (!bVar5) break;
    this->iterations = this->iterations + 1;
    if (this->multiplayer == false) {
      while (local_59 != false) {
        this->iterations = this->iterations + 1;
        if ((this->super_Solver).trace != 0) {
          poVar7 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->iterations + -1);
          std::operator<<(poVar7,"\x1b[m, player Even\n");
        }
        bitset::operator=(&CurG,this_00);
        local_59 = search(this,&CurG,(int)((this->super_Solver).game)->n_vertices + -1,0);
        iVar6 = (this->SolvedQ0).pointer;
        if (iVar6 != 0) {
          puVar4 = (this->Q).queue;
          (this->Q).queue = (this->SolvedQ0).queue;
          (this->SolvedQ0).queue = puVar4;
          iVar2 = (this->Q).pointer;
          (this->Q).pointer = iVar6;
          (this->SolvedQ0).pointer = iVar2;
          while (iVar6 != 0) {
            (this->Q).pointer = iVar6 + -1;
            uVar3 = (this->Q).queue[(long)iVar6 + -1];
            uVar8 = (ulong)(int)uVar3;
            if (((((this->super_Solver).game)->solved)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0
               ) {
              Solver::solve(&this->super_Solver,uVar3,0,this->str[uVar8]);
            }
            puVar1 = (this->G)._bits + (uVar8 >> 6);
            *puVar1 = *puVar1 & ~(1L << (uVar8 & 0x3f));
            attractVertices(this,0,uVar3,this_00,Z,this_00);
            attractTangles(this,0,uVar3,this_00,Z,this_00);
            iVar6 = (this->Q).pointer;
          }
        }
      }
      if (local_5a != false) {
        if ((this->super_Solver).trace != 0) {
          poVar7 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->iterations + -1);
          std::operator<<(poVar7,"\x1b[m, player Odd\n");
        }
        bitset::operator=(&CurG,this_00);
        local_5a = search(this,&CurG,(int)((this->super_Solver).game)->n_vertices + -1,1);
      }
    }
    else {
      if ((this->super_Solver).trace != 0) {
        poVar7 = std::operator<<((this->super_Solver).logger,
                                 "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->iterations + -1);
        std::operator<<(poVar7,"\x1b[m\n");
      }
      bitset::operator=(&CurG,this_00);
      search(this,&CurG,(int)((this->super_Solver).game)->n_vertices + -1,-1);
    }
    iVar6 = (this->SolvedQ0).pointer;
    if (iVar6 != 0) {
      puVar4 = (this->Q).queue;
      (this->Q).queue = (this->SolvedQ0).queue;
      (this->SolvedQ0).queue = puVar4;
      iVar2 = (this->Q).pointer;
      (this->Q).pointer = iVar6;
      (this->SolvedQ0).pointer = iVar2;
      while (iVar6 != 0) {
        (this->Q).pointer = iVar6 + -1;
        uVar3 = (this->Q).queue[(long)iVar6 + -1];
        uVar8 = (ulong)(int)uVar3;
        if (((((this->super_Solver).game)->solved)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
          Solver::solve(&this->super_Solver,uVar3,0,this->str[uVar8]);
        }
        puVar1 = (this->G)._bits + (uVar8 >> 6);
        *puVar1 = *puVar1 & ~(1L << (uVar8 & 0x3f));
        attractVertices(this,0,uVar3,this_00,Z,this_00);
        attractTangles(this,0,uVar3,this_00,Z,this_00);
        iVar6 = (this->Q).pointer;
      }
    }
    iVar6 = (this->SolvedQ1).pointer;
    if (iVar6 != 0) {
      puVar4 = (this->Q).queue;
      (this->Q).queue = (this->SolvedQ1).queue;
      (this->SolvedQ1).queue = puVar4;
      iVar2 = (this->Q).pointer;
      (this->Q).pointer = iVar6;
      (this->SolvedQ1).pointer = iVar2;
      while (iVar6 != 0) {
        (this->Q).pointer = iVar6 + -1;
        uVar3 = (this->Q).queue[(long)iVar6 + -1];
        uVar8 = (ulong)(int)uVar3;
        if (((((this->super_Solver).game)->solved)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
          Solver::solve(&this->super_Solver,uVar3,1,this->str[uVar8]);
        }
        puVar1 = (this->G)._bits + (uVar8 >> 6);
        *puVar1 = *puVar1 & ~(1L << (uVar8 & 0x3f));
        attractVertices(this,1,uVar3,this_00,&this->S1,this_00);
        attractTangles(this,1,uVar3,this_00,&this->S1,this_00);
        iVar6 = (this->Q).pointer;
      }
    }
  } while ((local_59 != false) || (local_5a != false));
  bitset::~bitset(&CurG);
  return;
}

Assistant:

void
PTLSolver::solve()
{
    bitset CurG(nodecount());

    iterations = 0;

    bool play0 = true;
    bool play1 = true;

    while (G.any()) {
        iterations++;

        if (multiplayer) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m\n";
            CurG = G;
            search(CurG, nodecount()-1, -1);
        } else {
            // play for player 0 until no changes, then player 1

            while (play0) {
                iterations++;
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Even\n";
                CurG = G;
                play0 = search(CurG, nodecount()-1, 0);

                if (SolvedQ0.nonempty()) {
                    Q.swap(SolvedQ0);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        // TODO: should we need the check?
                        if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                        G[v] = false; // remove from Game
                        attractVertices(0, v, G, S0, G);
                        attractTangles(0, v, G, S0, G);
                    }
                }
            }

            if (play1) {
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Odd\n";
                CurG = G;
                play1 = search(CurG, nodecount()-1, 1);
            }
        }

        /**
         * Extend any dominions that were found.
         * (Any solved vertices are now in <Q>.)
         */

        if (SolvedQ0.nonempty()) {
            Q.swap(SolvedQ0);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                G[v] = false; // remove from Game
                attractVertices(0, v, G, S0, G);
                attractTangles(0, v, G, S0, G);
            }
        }

        if (SolvedQ1.nonempty()) {
            Q.swap(SolvedQ1);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 1, str[v]);
                G[v] = false; // remove from Game
                attractVertices(1, v, G, S1, G);
                attractTangles(1, v, G, S1, G);
            }
        }

        if (!play0 and !play1) break;

#if NDEBUG and 0
        if (iterations == 1000) {
            logger << "stuck\n";
            exit(-1);
        }
#endif
    }
}